

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O3

int GetArgs(char *name)

{
  size_t sVar1;
  ushort **ppuVar2;
  ushort *puVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  char currarg [128];
  char local_b8 [136];
  
  sVar1 = strlen(name);
  iVar10 = (int)sVar1 + 1;
  Heap2Space(iVar10);
  strcpy(NextFNS,name);
  NextFNS = NextFNS + iVar10;
  if (High2 < NextFNS) {
    High2 = NextFNS;
  }
  lVar11 = (long)SrcLoc;
  ppuVar2 = __ctype_b_loc();
  puVar3 = *ppuVar2;
  lVar5 = (long)Line[lVar11];
  iVar10 = 0;
  if ((puVar3[lVar5] >> 0xd & 1) == 0) {
    pcVar12 = Line + lVar11;
    iVar10 = 0;
    do {
      cVar4 = (char)lVar5;
      if (cVar4 == '\0') {
        return iVar10;
      }
      if (((uint)lVar5 & 0xff) == 0x3b) {
        return iVar10;
      }
      uVar6 = (ulong)(cVar4 == '<');
      pcVar8 = pcVar12 + uVar6;
      cVar7 = pcVar12[uVar6];
      pcVar9 = pcVar8;
      pcVar13 = local_b8;
      if (cVar7 != '\0') {
        pcVar12 = pcVar12 + uVar6 + 1;
        pcVar13 = local_b8;
        do {
          if (cVar4 == '<') {
            pcVar9 = pcVar12;
            if (cVar7 == '>') goto LAB_001097b6;
          }
          else {
            if (cVar7 == ',') break;
            pcVar9 = pcVar8;
            if ((cVar7 == ';') || ((puVar3[cVar7] & 0x2000) != 0)) goto LAB_001097b6;
          }
          pcVar8 = pcVar8 + 1;
          *pcVar13 = cVar7;
          pcVar13 = pcVar13 + 1;
          cVar7 = *pcVar12;
          pcVar12 = pcVar12 + 1;
        } while (cVar7 != '\0');
        pcVar9 = pcVar12 + -1;
      }
LAB_001097b6:
      *pcVar13 = '\0';
      Heap2Space((int)(pcVar13 + (1 - (long)local_b8)));
      strcpy(NextFNS,local_b8);
      NextFNS = NextFNS + (long)(pcVar13 + (1 - (long)local_b8));
      if (High2 < NextFNS) {
        High2 = NextFNS;
      }
      iVar10 = iVar10 + 1;
      pcVar12 = pcVar9 + (*pcVar9 == ',');
      puVar3 = *ppuVar2;
      lVar5 = (long)pcVar9[*pcVar9 == ','];
    } while ((puVar3[lVar5] >> 0xd & 1) == 0);
  }
  return iVar10;
}

Assistant:

int 
GetArgs (char *name)
/* Gets macro arguments and adds them to FNStack after adding "name".
 Returns the number of arguments added to the stack.
 Note that this might not be the full number of arguments
 provided if the stack overflowed.				*/
{
	register char *s, *t;
	int narg, instring;
	char currarg[MAXLINE]; /* Current argument */

	narg = strlen(name) + 1;
	Heap2Space(narg); /* Find space for name. */
	strcpy(NextFNS, name); /* Add name to stack. */
	NextFNS += narg; /* Bump pointer. */
	if (NextFNS > High2)
		High2 = NextFNS; /* Update the high-water mark. */

	narg = 0; /* Argument counter */

	s = Line + SrcLoc; /* Now scan Line. */
	while (!isspace(*s) && (*s != ';') && (*s != '\0')) {
		t = currarg;
		if ((instring = (*s == '<'))) /* String delimiter */
			s++;
		//TODO: Maybe introduce a newinstring = (*s == '"') and go for it?
		while (1) {
			if (*s == '\0')
				break; /* End of line */
			if (instring) {
				if (*s == '>') {
					s++;
					break; /* End of string */
				}
			} else {
				if ((*s == ',') /* End of operand */
				|| isspace(*s) /* End of all operands */
				|| (*s == ';')) /* Start of comments */
					break;
			}
			*t++ = *s++; /* Get a character. */
		}
		*t++ = '\0';
		Heap2Space(t - currarg); /* Check for space. */
		strcpy(NextFNS, currarg); /* Store argument. */
		NextFNS += t - currarg; /* Next available space */
		if (NextFNS > High2)
			High2 = NextFNS; /* High-water mark */
		narg++; /* Count arguments. */
		if (*s == ',')
			s++; /* Skip over separator. */
	}
	return (narg); /* Successful completion */
}